

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

LY_ERR ylib_deviation(lyd_node *parent,lys_module *cur_mod,ly_bool bis)

{
  lys_module **pplVar1;
  char *value;
  LY_ERR LVar2;
  lysp_revision *plVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  
  if (cur_mod->implemented == '\0') {
    return LY_SUCCESS;
  }
  plVar5 = (lys_module *)0x0;
  while( true ) {
    pplVar1 = cur_mod->deviated_by;
    if (pplVar1 == (lys_module **)0x0) {
      plVar4 = (lys_module *)0x0;
    }
    else {
      plVar4 = pplVar1[-1];
    }
    if (plVar4 <= plVar5) {
      return LY_SUCCESS;
    }
    value = pplVar1[(long)plVar5]->name;
    if (bis == '\0') {
      plVar3 = pplVar1[(long)plVar5]->parsed->revs;
      if (plVar3 == (lysp_revision *)0x0) {
        plVar3 = (lysp_revision *)0x1c9aa8;
      }
      LVar2 = lyd_new_list(parent,(lys_module *)0x0,"deviation",0,(lyd_node **)0x0,value,plVar3);
    }
    else {
      LVar2 = lyd_new_term(parent,(lys_module *)0x0,"deviation",value,0,(lyd_node **)0x0);
    }
    if (LVar2 != LY_SUCCESS) break;
    plVar5 = (lys_module *)((long)&plVar5->ctx + 1);
  }
  return LVar2;
}

Assistant:

static LY_ERR
ylib_deviation(struct lyd_node *parent, const struct lys_module *cur_mod, ly_bool bis)
{
    LY_ARRAY_COUNT_TYPE i;
    struct lys_module *mod;

    if (!cur_mod->implemented) {
        /* no deviations of the module for certain */
        return LY_SUCCESS;
    }

    LY_ARRAY_FOR(cur_mod->deviated_by, i) {
        mod = cur_mod->deviated_by[i];

        if (bis) {
            LY_CHECK_RET(lyd_new_term(parent, NULL, "deviation", mod->name, 0, NULL));
        } else {
            LY_CHECK_RET(lyd_new_list(parent, NULL, "deviation", 0, NULL, mod->name,
                    (mod->parsed->revs ? mod->parsed->revs[0].date : "")));
        }
    }

    return LY_SUCCESS;
}